

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O2

bool __thiscall
Clasp::mt::SharedLitsClause::updateWatch(SharedLitsClause *this,Solver *s,uint32 pos)

{
  uint uVar1;
  pointer puVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  SharedLiterals *pSVar6;
  uint32 *puVar7;
  
  uVar1 = (this->super_ClauseHead).head_[pos ^ 1].rep_;
  pSVar6 = (this->super_ClauseHead).field_0.shared_;
  puVar2 = (s->assign_).assign_.ebo_.buf;
  uVar3 = (ulong)(pSVar6->size_type_ & 0xfffffffc);
  pSVar6 = pSVar6 + 1;
  do {
    puVar7 = &pSVar6->size_type_;
    if (uVar3 == 0) {
switchD_0017c2de_default:
      return uVar3 != 0;
    }
    uVar4 = (pSVar6->refCount_).super___atomic_base<int>._M_i;
    if (((byte)(*(byte *)((long)puVar2 + (ulong)(uVar4 & 0xfffffffc)) & 3) !=
         (byte)(((uVar4 & 2) == 0) + 1U)) && (1 < (uVar4 ^ uVar1))) {
      (this->super_ClauseHead).head_[pos].rep_ = uVar4;
      uVar5 = (uint)(uVar3 >> 2);
      uVar4 = 8;
      if (uVar5 < 8) {
        uVar4 = uVar5;
      }
      switch(uVar4) {
      case 2:
switchD_0017c2de_caseD_2:
        uVar4 = pSVar6->size_type_;
        if (((byte)(*(byte *)((long)puVar2 + (ulong)(uVar4 & 0xfffffffc)) & 3) ==
             (byte)(((uVar4 & 2) == 0) + 1U)) || ((uVar1 ^ uVar4) < 2))
        goto switchD_0017c2de_default;
        break;
      case 3:
switchD_0017c2de_caseD_3:
        uVar4 = pSVar6->size_type_;
        pSVar6 = (SharedLiterals *)&pSVar6->size_type_;
        if (((byte)(*(byte *)((long)puVar2 + (ulong)(uVar4 & 0xfffffffc)) & 3) ==
             (byte)(((uVar4 & 2) == 0) + 1U)) || ((uVar4 ^ uVar1) < 2))
        goto switchD_0017c2de_caseD_2;
        break;
      case 4:
switchD_0017c2de_caseD_4:
        uVar4 = pSVar6->size_type_;
        pSVar6 = (SharedLiterals *)&pSVar6->size_type_;
        if (((byte)(*(byte *)((long)puVar2 + (ulong)(uVar4 & 0xfffffffc)) & 3) ==
             (byte)(((uVar4 & 2) == 0) + 1U)) || ((uVar4 ^ uVar1) < 2))
        goto switchD_0017c2de_caseD_3;
        break;
      case 5:
switchD_0017c2de_caseD_5:
        uVar4 = pSVar6->size_type_;
        pSVar6 = (SharedLiterals *)&pSVar6->size_type_;
        if (((byte)(*(byte *)((long)puVar2 + (ulong)(uVar4 & 0xfffffffc)) & 3) ==
             (byte)(((uVar4 & 2) == 0) + 1U)) || ((uVar4 ^ uVar1) < 2))
        goto switchD_0017c2de_caseD_4;
        break;
      case 6:
switchD_0017c2de_caseD_6:
        uVar4 = pSVar6->size_type_;
        pSVar6 = (SharedLiterals *)&pSVar6->size_type_;
        if (((byte)(*(byte *)((long)puVar2 + (ulong)(uVar4 & 0xfffffffc)) & 3) ==
             (byte)(((uVar4 & 2) == 0) + 1U)) || ((uVar4 ^ uVar1) < 2))
        goto switchD_0017c2de_caseD_5;
        break;
      case 7:
LAB_0017c2e3:
        uVar4 = pSVar6->size_type_;
        pSVar6 = (SharedLiterals *)&pSVar6->size_type_;
        if (((byte)(*(byte *)((long)puVar2 + (ulong)(uVar4 & 0xfffffffc)) & 3) ==
             (byte)(((uVar4 & 2) == 0) + 1U)) || ((uVar4 ^ uVar1) < 2))
        goto switchD_0017c2de_caseD_6;
        break;
      case 8:
        uVar4 = *puVar7;
        pSVar6 = (SharedLiterals *)puVar7;
        if (((byte)(*(byte *)((long)puVar2 + (ulong)(uVar4 & 0xfffffffc)) & 3) ==
             (byte)(((uVar4 & 2) == 0) + 1U)) || ((uVar4 ^ uVar1) < 2)) goto LAB_0017c2e3;
        break;
      default:
        goto switchD_0017c2de_default;
      }
      (this->super_ClauseHead).head_[2].rep_ = uVar4;
      goto switchD_0017c2de_default;
    }
    uVar3 = uVar3 - 4;
    pSVar6 = (SharedLiterals *)puVar7;
  } while( true );
}

Assistant:

bool SharedLitsClause::updateWatch(Solver& s, uint32 pos) {
	Literal  other = head_[1^pos];
	for (const Literal* r = shared_->begin(), *end = shared_->end(); r != end; ++r) {
		// at this point we know that head_[2] is false, so we only need to check
		// that we do not watch the other watched literal twice!
		if (!s.isFalse(*r) && *r != other) {
			head_[pos] = *r; // replace watch
			// try to replace cache literal
			switch( std::min(static_cast<uint32>(8), static_cast<uint32>(end-r)) ) {
				case 8: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				case 7: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				case 6: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				case 5: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				case 4: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				case 3: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				case 2: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				default: return true;
			}
		}
	}
	return false;
}